

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

void google::protobuf::compiler::java::PrintEnumVerifierLogic
               (Printer *printer,FieldDescriptor *descriptor,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables,char *var_name,char *terminating_string,bool enforce_lite)

{
  AlphaNum *in_RDI;
  byte in_R9B;
  char *unaff_retaddr;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000008;
  Printer *in_stack_00000010;
  string enum_verifier_string;
  string *in_stack_fffffffffffffe18;
  AlphaNum *in_stack_fffffffffffffe20;
  string local_160 [32];
  AlphaNum *in_stack_fffffffffffffec0;
  AlphaNum *in_stack_fffffffffffffec8;
  AlphaNum *in_stack_fffffffffffffed8;
  AlphaNum *in_stack_fffffffffffffee0;
  AlphaNum *in_stack_fffffffffffffee8;
  string local_50 [39];
  byte local_29;
  AlphaNum *local_8;
  
  local_29 = in_R9B & 1;
  local_8 = in_RDI;
  if (local_29 == 0) {
    strings::AlphaNum::AlphaNum(in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
    strings::AlphaNum::AlphaNum(in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
    strings::AlphaNum::AlphaNum(in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
    StrCat_abi_cxx11_(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8)
    ;
  }
  else {
    strings::AlphaNum::AlphaNum(in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
    strings::AlphaNum::AlphaNum(in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
    StrCat_abi_cxx11_(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  }
  strings::AlphaNum::AlphaNum(local_8,in_stack_fffffffffffffe18);
  strings::AlphaNum::AlphaNum(local_8,(char *)in_stack_fffffffffffffe18);
  StrCat_abi_cxx11_(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::__cxx11::string::c_str();
  io::Printer::Print(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void PrintEnumVerifierLogic(io::Printer* printer,
                            const FieldDescriptor* descriptor,
                            const std::map<std::string, std::string>& variables,
                            const char* var_name,
                            const char* terminating_string, bool enforce_lite) {
  std::string enum_verifier_string =
      enforce_lite ? StrCat(var_name, ".internalGetVerifier()")
                   : StrCat(
                         "new com.google.protobuf.Internal.EnumVerifier() {\n"
                         "        @java.lang.Override\n"
                         "        public boolean isInRange(int number) {\n"
                         "          return ",
                         var_name,
                         ".forNumber(number) != null;\n"
                         "        }\n"
                         "      }");
  printer->Print(
      variables,
      StrCat(enum_verifier_string, terminating_string).c_str());
}